

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O0

int __thiscall Fl_Tabs::tab_positions(Fl_Tabs *this)

{
  Fl_Boxtype t;
  int iVar1;
  uint uVar2;
  int *piVar3;
  int local_48;
  int W;
  int l;
  int r;
  int ht;
  int wt;
  Fl_Widget *o;
  char prev_draw_shortcut;
  Fl_Widget **ppFStack_28;
  int i;
  Fl_Widget **a;
  int selected;
  int nc;
  Fl_Tabs *this_local;
  
  _selected = this;
  a._4_4_ = Fl_Group::children(&this->super_Fl_Group);
  if (a._4_4_ != this->tab_count) {
    clear_tab_positions(this);
    if (a._4_4_ != 0) {
      piVar3 = (int *)malloc((long)(a._4_4_ + 1) << 2);
      this->tab_pos = piVar3;
      piVar3 = (int *)malloc((long)(a._4_4_ + 1) << 2);
      this->tab_width = piVar3;
    }
    this->tab_count = a._4_4_;
  }
  if (a._4_4_ == 0) {
    this_local._4_4_ = 0;
  }
  else {
    a._0_4_ = 0;
    ppFStack_28 = Fl_Group::array(&this->super_Fl_Group);
    o._3_1_ = fl_draw_shortcut;
    fl_draw_shortcut = '\x01';
    t = Fl_Widget::box((Fl_Widget *)this);
    iVar1 = Fl::box_dx(t);
    *this->tab_pos = iVar1;
    for (o._4_4_ = 0; o._4_4_ < a._4_4_; o._4_4_ = o._4_4_ + 1) {
      _ht = *ppFStack_28;
      ppFStack_28 = ppFStack_28 + 1;
      uVar2 = Fl_Widget::visible(_ht);
      if (uVar2 != 0) {
        a._0_4_ = o._4_4_;
      }
      r = 0;
      l = 0;
      Fl_Widget::measure_label(_ht,&r,&l);
      this->tab_width[o._4_4_] = r + 10;
      this->tab_pos[o._4_4_ + 1] = this->tab_pos[o._4_4_] + this->tab_width[o._4_4_] + 2;
    }
    fl_draw_shortcut = o._3_1_;
    W = Fl_Widget::w((Fl_Widget *)this);
    if (W < this->tab_pos[o._4_4_]) {
      this->tab_pos[o._4_4_] = W;
      o._4_4_ = a._4_4_;
      while (iVar1 = o._4_4_ + -1, o._4_4_ != 0) {
        local_48 = W - this->tab_width[iVar1];
        if (this->tab_pos[o._4_4_] < local_48) {
          local_48 = this->tab_pos[o._4_4_];
        }
        if (this->tab_pos[iVar1] <= local_48) break;
        this->tab_pos[iVar1] = local_48;
        W = W + -10;
        o._4_4_ = iVar1;
      }
      for (o._4_4_ = 0;
          (o._4_4_ < a._4_4_ &&
          (SBORROW4(this->tab_pos[o._4_4_],o._4_4_ * 10) !=
           this->tab_pos[o._4_4_] + o._4_4_ * -10 < 0)); o._4_4_ = o._4_4_ + 1) {
        this->tab_pos[o._4_4_] = o._4_4_ * 10;
        iVar1 = Fl_Widget::w((Fl_Widget *)this);
        iVar1 = (iVar1 + -1 + (a._4_4_ - o._4_4_) * -10) - this->tab_pos[o._4_4_];
        if (iVar1 < this->tab_width[o._4_4_]) {
          this->tab_width[o._4_4_] = iVar1;
        }
      }
      for (o._4_4_ = a._4_4_; (int)a < o._4_4_; o._4_4_ = o._4_4_ + -1) {
        this->tab_pos[o._4_4_] = this->tab_pos[o._4_4_ + -1] + this->tab_width[o._4_4_ + -1];
      }
      this_local._4_4_ = (int)a;
    }
    else {
      this_local._4_4_ = (int)a;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Tabs::tab_positions() {
  const int nc = children();
  if (nc != tab_count) {
    clear_tab_positions();
    if (nc) {
      tab_pos   = (int*)malloc((nc+1)*sizeof(int));
      tab_width = (int*)malloc((nc+1)*sizeof(int));
    }
    tab_count = nc;
  }
  if (nc == 0) return 0;
  int selected = 0;
  Fl_Widget*const* a = array();
  int i;
  char prev_draw_shortcut = fl_draw_shortcut;
  fl_draw_shortcut = 1;

  tab_pos[0] = Fl::box_dx(box());
  for (i=0; i<nc; i++) {
    Fl_Widget* o = *a++;
    if (o->visible()) selected = i;

    int wt = 0; int ht = 0;
    o->measure_label(wt,ht);

    tab_width[i] = wt + EXTRASPACE;
    tab_pos[i+1] = tab_pos[i] + tab_width[i] + BORDER;
  }
  fl_draw_shortcut = prev_draw_shortcut;

  int r = w();
  if (tab_pos[i] <= r) return selected;
  // uh oh, they are too big:
  // pack them against right edge:
  tab_pos[i] = r;
  for (i = nc; i--;) {
    int l = r-tab_width[i];
    if (tab_pos[i+1] < l) l = tab_pos[i+1];
    if (tab_pos[i] <= l) break;
    tab_pos[i] = l;
    r -= EXTRASPACE;
  }
  // pack them against left edge and truncate width if they still don't fit:
  for (i = 0; i<nc; i++) {
    if (tab_pos[i] >= i*EXTRASPACE) break;
    tab_pos[i] = i*EXTRASPACE;
    int W = w()-1-EXTRASPACE*(nc-i) - tab_pos[i];
    if (tab_width[i] > W) tab_width[i] = W;
  }
  // adjust edges according to visiblity:
  for (i = nc; i > selected; i--) {
    tab_pos[i] = tab_pos[i-1] + tab_width[i-1];
  }
  return selected;
}